

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vecmath.h
# Opt level: O1

Float pbrt::AngleBetween<float>(Vector3<float> *v1,Vector3<float> *v2)

{
  float fVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  float fVar5;
  undefined8 uVar6;
  bool bVar7;
  undefined1 auVar8 [16];
  float fVar9;
  undefined1 auVar10 [64];
  undefined1 extraout_var [60];
  
  fVar9 = (v1->super_Tuple3<pbrt::Vector3,_float>).x;
  fVar1 = (v1->super_Tuple3<pbrt::Vector3,_float>).y;
  fVar2 = (v2->super_Tuple3<pbrt::Vector3,_float>).x;
  fVar3 = (v2->super_Tuple3<pbrt::Vector3,_float>).y;
  auVar8 = vfmadd231ss_fma(ZEXT416((uint)(fVar1 * fVar3)),ZEXT416((uint)fVar9),ZEXT416((uint)fVar2))
  ;
  fVar4 = (v1->super_Tuple3<pbrt::Vector3,_float>).z;
  fVar5 = (v2->super_Tuple3<pbrt::Vector3,_float>).z;
  auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)fVar4),ZEXT416((uint)fVar5));
  if (0.0 <= auVar8._0_4_) {
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)((fVar3 - fVar1) * (fVar3 - fVar1))),
                             ZEXT416((uint)(fVar2 - fVar9)),ZEXT416((uint)(fVar2 - fVar9)));
    auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)(fVar5 - fVar4)),ZEXT416((uint)(fVar5 - fVar4)));
    if (auVar8._0_4_ < 0.0) {
      fVar9 = sqrtf(auVar8._0_4_);
    }
    else {
      auVar8 = vsqrtss_avx(auVar8,auVar8);
      fVar9 = auVar8._0_4_;
    }
    auVar8 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar9 * 0.5)));
    uVar6 = vcmpss_avx512f(ZEXT416((uint)(fVar9 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar7 = (bool)((byte)uVar6 & 1);
    fVar9 = asinf((float)((uint)bVar7 * -0x40800000 + (uint)!bVar7 * auVar8._0_4_));
    fVar9 = fVar9 + fVar9;
  }
  else {
    auVar8 = vfmadd231ss_fma(ZEXT416((uint)((fVar1 + fVar3) * (fVar1 + fVar3))),
                             ZEXT416((uint)(fVar9 + fVar2)),ZEXT416((uint)(fVar9 + fVar2)));
    auVar8 = vfmadd231ss_fma(auVar8,ZEXT416((uint)(fVar4 + fVar5)),ZEXT416((uint)(fVar4 + fVar5)));
    if (auVar8._0_4_ < 0.0) {
      fVar9 = sqrtf(auVar8._0_4_);
    }
    else {
      auVar8 = vsqrtss_avx(auVar8,auVar8);
      fVar9 = auVar8._0_4_;
    }
    auVar8 = vminss_avx(SUB6416(ZEXT464(0x3f800000),0),ZEXT416((uint)(fVar9 * 0.5)));
    uVar6 = vcmpss_avx512f(ZEXT416((uint)(fVar9 * 0.5)),SUB6416(ZEXT464(0xbf800000),0),1);
    bVar7 = (bool)((byte)uVar6 & 1);
    auVar10._0_4_ = asinf((float)((uint)bVar7 * -0x40800000 + (uint)!bVar7 * auVar8._0_4_));
    auVar10._4_60_ = extraout_var;
    auVar8 = vfmadd213ss_fma(auVar10._0_16_,SUB6416(ZEXT464(0xc0000000),0),ZEXT416(0x40490fdb));
    fVar9 = auVar8._0_4_;
  }
  return fVar9;
}

Assistant:

PBRT_CPU_GPU inline Float AngleBetween(const Vector3<T> &v1, const Vector3<T> &v2) {
    if (Dot(v1, v2) < 0)
        return Pi - 2 * SafeASin(Length(v1 + v2) / 2);
    else
        return 2 * SafeASin(Length(v2 - v1) / 2);
}